

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void Net_SkipCommand(int type,BYTE **stream)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  uint local_2c;
  long lStack_28;
  int numweapons;
  size_t skip;
  BYTE t;
  BYTE **stream_local;
  int type_local;
  
  switch(type) {
  case 4:
  case 5:
  case 6:
  case 8:
  case 0xe:
  case 0x1a:
  case 0x25:
  case 0x26:
  case 0x2b:
  case 0x2c:
  case 0x32:
  case 0x3a:
  case 0x44:
    sVar2 = strlen((char *)*stream);
    lStack_28 = sVar2 + 1;
    break;
  default:
    return;
  case 9:
  case 0x21:
    lStack_28 = (long)(int)((**stream & 0x3f) + 1);
    if (type == 9) {
      bVar1 = **stream >> 6;
      if (bVar1 == 0) {
        lStack_28 = lStack_28 + 1;
      }
      else if (bVar1 - 1 < 2) {
        lStack_28 = lStack_28 + 4;
      }
      else if (bVar1 == 3) {
        sVar2 = strlen((char *)(*stream + lStack_28));
        lStack_28 = sVar2 + 1 + lStack_28;
      }
    }
    else {
      lStack_28 = lStack_28 + 1;
    }
    break;
  case 10:
  case 0xd:
  case 0x1b:
  case 0x1c:
  case 0x30:
  case 0x31:
    lStack_28 = 1;
    break;
  case 0xb:
  case 0x2f:
    sVar2 = strlen((char *)*stream);
    lStack_28 = sVar2 + 3;
    break;
  case 0xc:
    sVar2 = strlen((char *)(*stream + 1));
    lStack_28 = sVar2 + 2;
    break;
  case 0x10:
    sVar2 = strlen((char *)(*stream + 1));
    lStack_28 = sVar2 + 6;
    break;
  case 0x13:
  case 0x22:
    lStack_28 = 4;
    break;
  case 0x15:
    sVar2 = strlen((char *)*stream);
    sVar3 = strlen((char *)(*stream + sVar2 + 1));
    lStack_28 = sVar3 + 1 + sVar2 + 1;
    break;
  case 0x1d:
    sVar2 = strlen((char *)(*stream + 1));
    lStack_28 = sVar2 + 2;
    break;
  case 0x20:
  case 0x28:
    lStack_28 = (long)(int)((uint)(*stream)[2] * 4 + 3);
    break;
  case 0x23:
    lStack_28 = 6;
    break;
  case 0x34:
  case 0x35:
  case 0x36:
    sVar2 = strlen((char *)*stream);
    lStack_28 = sVar2 + 0x1a;
    break;
  case 0x37:
  case 0x38:
    lStack_28 = (long)(((int)(uint)(*stream)[1] >> 7) + 2);
    break;
  case 0x39:
  case 0x43:
    lStack_28 = (long)(int)((type == 0x43) + 2);
    for (local_2c = (uint)(*stream)[lStack_28 + -1]; 0 < (int)local_2c; local_2c = local_2c - 1) {
      lStack_28 = (((int)(uint)(*stream)[lStack_28] >> 7) + 1) + lStack_28;
    }
    break;
  case 0x3b:
    lStack_28 = 3;
    break;
  case 0x3e:
    lStack_28 = (long)(int)((uint)(*stream)[2] * 4 + 3);
    break;
  case 0x3f:
    lStack_28 = 2;
    break;
  case 0x41:
    sVar2 = strlen((char *)*stream);
    lStack_28 = (long)(int)(((*stream)[sVar2 + 1] & 0x7f) << 2) + sVar2 + 2;
  }
  *stream = *stream + lStack_28;
  return;
}

Assistant:

void Net_SkipCommand (int type, BYTE **stream)
{
	BYTE t;
	size_t skip;

	switch (type)
	{
		case DEM_SAY:
			skip = strlen ((char *)(*stream + 1)) + 2;
			break;

		case DEM_ADDBOT:
			skip = strlen ((char *)(*stream + 1)) + 6;
			break;

		case DEM_GIVECHEAT:
		case DEM_TAKECHEAT:
			skip = strlen ((char *)(*stream)) + 3;
			break;

		case DEM_SUMMON2:
		case DEM_SUMMONFRIEND2:
		case DEM_SUMMONFOE2:
			skip = strlen ((char *)(*stream)) + 26;
			break;
		case DEM_CHANGEMAP2:
			skip = strlen((char *)(*stream + 1)) + 2;
			break;
		case DEM_MUSICCHANGE:
		case DEM_PRINT:
		case DEM_CENTERPRINT:
		case DEM_UINFCHANGED:
		case DEM_CHANGEMAP:
		case DEM_SUMMON:
		case DEM_SUMMONFRIEND:
		case DEM_SUMMONFOE:
		case DEM_SUMMONMBF:
		case DEM_REMOVE:
		case DEM_SPRAY:
		case DEM_MORPHEX:
		case DEM_KILLCLASSCHEAT:
			skip = strlen ((char *)(*stream)) + 1;
			break;

		case DEM_WARPCHEAT:
			skip = 6;
			break;

		case DEM_INVUSE:
		case DEM_INVDROP:
			skip = 4;
			break;

		case DEM_GENERICCHEAT:
		case DEM_DROPPLAYER:
		case DEM_FOV:
		case DEM_MYFOV:
		case DEM_ADDCONTROLLER:
		case DEM_DELCONTROLLER:
			skip = 1;
			break;

		case DEM_SAVEGAME:
			skip = strlen ((char *)(*stream)) + 1;
			skip += strlen ((char *)(*stream) + skip) + 1;
			break;

		case DEM_SINFCHANGEDXOR:
		case DEM_SINFCHANGED:
			t = **stream;
			skip = 1 + (t & 63);
			if (type == DEM_SINFCHANGED)
			{
				switch (t >> 6)
				{
				case CVAR_Bool:
					skip += 1;
					break;
				case CVAR_Int: case CVAR_Float:
					skip += 4;
					break;
				case CVAR_String:
					skip += strlen ((char *)(*stream + skip)) + 1;
					break;
				}
			}
			else
			{
				skip += 1;
			}
			break;

		case DEM_RUNSCRIPT:
		case DEM_RUNSCRIPT2:
			skip = 3 + *(*stream + 2) * 4;
			break;

		case DEM_RUNNAMEDSCRIPT:
			skip = strlen((char *)(*stream)) + 2;
			skip += ((*(*stream + skip - 1)) & 127) * 4;
			break;

		case DEM_RUNSPECIAL:
			skip = 3 + *(*stream + 2) * 4;
			break;

		case DEM_CONVREPLY:
			skip = 3;
			break;

		case DEM_SETSLOT:
		case DEM_SETSLOTPNUM:
			{
				skip = 2 + (type == DEM_SETSLOTPNUM);
				for(int numweapons = (*stream)[skip-1]; numweapons > 0; numweapons--)
				{
					skip += 1 + ((*stream)[skip] >> 7);
				}
			}
			break;

		case DEM_ADDSLOT:
		case DEM_ADDSLOTDEFAULT:
			skip = 2 + ((*stream)[1] >> 7);
			break;

		case DEM_SETPITCHLIMIT:
			skip = 2;
			break;

		default:
			return;
	}

	*stream += skip;
}